

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O3

bool __thiscall
cmExportFileGenerator::PopulateExportProperties
          (cmExportFileGenerator *this,cmGeneratorTarget *gte,ImportPropertyMap *properties,
          string *errorMessage)

{
  pointer pcVar1;
  char *pcVar2;
  bool bVar3;
  int iVar4;
  cmPropertyMap *this_00;
  char *pcVar5;
  size_t sVar6;
  string *psVar7;
  ostream *poVar8;
  mapped_type *pmVar9;
  string *str1;
  string evaluatedValue;
  ostringstream e;
  string local_218;
  ImportPropertyMap *local_1f8;
  string *local_1f0;
  cmPropertyMap *local_1e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1e0;
  long *local_1c8 [2];
  long local_1b8 [2];
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  local_1f8 = properties;
  this_00 = cmTarget::GetProperties(gte->Target);
  pcVar1 = local_1a8 + 0x10;
  local_1a8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"EXPORT_PROPERTIES","");
  pcVar5 = cmPropertyMap::GetPropertyValue(this_00,(string *)local_1a8);
  if ((pointer)local_1a8._0_8_ != pcVar1) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  if (pcVar5 != (char *)0x0) {
    local_1a8._0_8_ = pcVar1;
    sVar6 = strlen(pcVar5);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,pcVar5,pcVar5 + sVar6);
    cmSystemTools::ExpandedListArgument(&local_1e0,(string *)local_1a8,false);
    local_1e8 = this_00;
    if ((pointer)local_1a8._0_8_ != pcVar1) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    local_1f0 = local_1e0.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    str1 = local_1e0.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
    if (local_1e0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_1e0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        bVar3 = cmsys::SystemTools::StringStartsWith(str1,"IMPORTED_");
        if ((bVar3) || (bVar3 = cmsys::SystemTools::StringStartsWith(str1,"INTERFACE_"), bVar3)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Target \"",8);
          psVar7 = cmTarget::GetName_abi_cxx11_(gte->Target);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,(psVar7->_M_dataplus)._M_p,
                              psVar7->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\" contains property \"",0x15);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,(str1->_M_dataplus)._M_p,str1->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,"\" in EXPORT_PROPERTIES but IMPORTED_* and INTERFACE_* ",0x36);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"properties are reserved.",0x18)
          ;
          std::__cxx11::stringbuf::str();
          std::__cxx11::string::operator=((string *)errorMessage,(string *)&local_218);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218._M_dataplus._M_p != &local_218.field_2) {
            operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
LAB_003631f5:
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_1e0);
          return false;
        }
        pcVar5 = cmPropertyMap::GetPropertyValue(local_1e8,str1);
        if (pcVar5 != (char *)0x0) {
          local_1a8._0_8_ = local_1a8 + 0x10;
          sVar6 = strlen(pcVar5);
          std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,pcVar5,pcVar5 + sVar6)
          ;
          cmGeneratorExpression::Preprocess
                    (&local_218,(string *)local_1a8,StripAllGeneratorExpressions,false);
          if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
            operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
          }
          iVar4 = std::__cxx11::string::compare((char *)&local_218);
          if (iVar4 == 0) {
            pmVar9 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](local_1f8,str1);
            pcVar2 = (char *)pmVar9->_M_string_length;
            strlen(pcVar5);
            std::__cxx11::string::_M_replace((ulong)pmVar9,0,pcVar2,(ulong)pcVar5);
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Target \"",8);
            psVar7 = cmTarget::GetName_abi_cxx11_(gte->Target);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1a8,(psVar7->_M_dataplus)._M_p,
                                psVar7->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar8,"\" contains property \"",0x15);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar8,(str1->_M_dataplus)._M_p,str1->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar8,"\" in EXPORT_PROPERTIES but this property contains a ",0x34);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar8,"generator expression. This is not allowed.",0x2a);
            std::__cxx11::stringbuf::str();
            std::__cxx11::string::operator=((string *)errorMessage,(string *)local_1c8);
            if (local_1c8[0] != local_1b8) {
              operator_delete(local_1c8[0],local_1b8[0] + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            std::ios_base::~ios_base(local_138);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218._M_dataplus._M_p != &local_218.field_2) {
            operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
          }
          if (iVar4 != 0) goto LAB_003631f5;
        }
        str1 = str1 + 1;
      } while (str1 != local_1f0);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1e0);
  }
  return true;
}

Assistant:

bool cmExportFileGenerator::PopulateExportProperties(
  cmGeneratorTarget* gte, ImportPropertyMap& properties,
  std::string& errorMessage)
{
  auto& targetProperties = gte->Target->GetProperties();
  if (const char* exportProperties =
        targetProperties.GetPropertyValue("EXPORT_PROPERTIES")) {
    for (auto& prop : cmSystemTools::ExpandedListArgument(exportProperties)) {
      /* Black list reserved properties */
      if (cmSystemTools::StringStartsWith(prop, "IMPORTED_") ||
          cmSystemTools::StringStartsWith(prop, "INTERFACE_")) {
        std::ostringstream e;
        e << "Target \"" << gte->Target->GetName() << "\" contains property \""
          << prop << "\" in EXPORT_PROPERTIES but IMPORTED_* and INTERFACE_* "
          << "properties are reserved.";
        errorMessage = e.str();
        return false;
      }
      auto propertyValue = targetProperties.GetPropertyValue(prop);
      if (propertyValue == nullptr) {
        // Asked to export a property that isn't defined on the target. Do not
        // consider this an error, there's just nothing to export.
        continue;
      }
      std::string evaluatedValue = cmGeneratorExpression::Preprocess(
        propertyValue, cmGeneratorExpression::StripAllGeneratorExpressions);
      if (evaluatedValue != propertyValue) {
        std::ostringstream e;
        e << "Target \"" << gte->Target->GetName() << "\" contains property \""
          << prop << "\" in EXPORT_PROPERTIES but this property contains a "
          << "generator expression. This is not allowed.";
        errorMessage = e.str();
        return false;
      }
      properties[prop] = propertyValue;
    }
  }
  return true;
}